

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

int __thiscall tcu::Texture1DArrayView::selectLayer(Texture1DArrayView *this,float r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  
  fVar4 = floorf(r + 0.5);
  iVar2 = (int)fVar4;
  iVar3 = (this->m_levels->m_size).m_data[1] + -1;
  if (iVar2 < iVar3) {
    iVar3 = iVar2;
  }
  iVar1 = 0;
  if (-1 < iVar2) {
    iVar1 = iVar3;
  }
  return iVar1;
}

Assistant:

inline int Texture1DArrayView::selectLayer (float r) const
{
	DE_ASSERT(m_numLevels > 0 && m_levels);
	return de::clamp(deFloorFloatToInt32(r + 0.5f), 0, m_levels[0].getHeight()-1);
}